

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::releasePayload(Value *this)

{
  char *pcVar1;
  bool bVar2;
  ValueType VVar3;
  Value *in_RDI;
  
  VVar3 = type(in_RDI);
  if (realValue < VVar3) {
    if (VVar3 == stringValue) {
      bVar2 = isAllocated(in_RDI);
      if (bVar2) {
        releasePrefixedStringValue((char *)0x1fbab8);
      }
    }
    else if (VVar3 != booleanValue) {
      if (1 < VVar3 - arrayValue) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_value.cpp"
                      ,0x415,"void Json::Value::releasePayload()");
      }
      pcVar1 = (in_RDI->value_).string_;
      if (pcVar1 != (char *)0x0) {
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::~map((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                *)0x1fbad7);
        operator_delete(pcVar1);
      }
    }
  }
  return;
}

Assistant:

void Value::releasePayload() {
  switch (type()) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (isAllocated())
      releasePrefixedStringValue(value_.string_);
    break;
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}